

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O2

void regex_free(regex_handle *re)

{
  long *__ptr;
  
  __ptr = (long *)re->priv;
  if (__ptr != (long *)0x0) {
    if (*__ptr != 0) {
      pcre2_code_free_8(*__ptr);
      __ptr = (long *)re->priv;
    }
    free(__ptr);
    re->priv = (void *)0x0;
  }
  return;
}

Assistant:

void regex_free(struct regex_handle *re)
{
	if (re->priv != NULL) {
		struct regex_priv *priv = re->priv;

		if (priv->re != NULL)
			pcre2_code_free(priv->re);

		free(re->priv);
		re->priv = NULL;
	}
}